

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O2

void __thiscall
ObjTypeSpecFldInfo::ObjTypeSpecFldInfo
          (ObjTypeSpecFldInfo *this,uint id,TypeId typeId,JITType *initialType,bool usesAuxSlot,
          bool isLoadedFromProto,bool usesAccessor,bool isFieldValueFixed,bool keepFieldValue,
          bool isBuiltIn,uint16 slotIndex,PropertyId propertyId,DynamicObject *protoObject,
          PropertyGuard *propertyGuard,JITTimeConstructorCache *ctorCache,
          FixedFieldInfo *fixedFieldInfoArray)

{
  TypeIDL *ptr;
  JITTimeConstructorCacheIDL *ptr_00;
  FixedFieldIDL *ptr_01;
  undefined7 in_register_00000081;
  int iVar1;
  undefined7 in_register_00000089;
  ushort uVar2;
  
  (this->m_data).polymorphicInfoArray.ptr = (ObjTypeSpecPolymorphicInfoIDL *)0x0;
  iVar1 = (int)CONCAT71(in_register_00000089,isLoadedFromProto);
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (usesAccessor ^ 1) << 5;
  }
  (this->m_data).ctorCache.ptr = (JITTimeConstructorCacheIDL *)0x0;
  (this->m_data).fixedFieldInfoArray.ptr = (FixedFieldIDL *)0x0;
  (this->m_data).typeSet.ptr = (EquivalentTypeSetIDL *)0x0;
  (this->m_data).initialType.ptr = (TypeIDL *)0x0;
  (this->m_data).protoObjectAddr.ptr = (void *)0x0;
  (this->m_data).propertyGuardValueAddr.ptr = (void *)0x0;
  (this->m_data).flags =
       (ushort)((int)CONCAT71(in_register_00000081,usesAuxSlot) << 4) |
       (ushort)(initialType != (JITType *)0x0) << 0xb | (ushort)(iVar1 << 6) |
       (ushort)usesAccessor << 7 | uVar2 |
       (ushort)isBuiltIn << 0xd | (ushort)keepFieldValue << 9 | (ushort)isFieldValueFixed << 8 |
       0x1001;
  (this->m_data).id = id;
  (this->m_data).typeId = typeId;
  ptr = JITType::GetData(initialType);
  Memory::WriteBarrierPtr<TypeIDL>::WriteBarrierSet(&(this->m_data).initialType,ptr);
  (this->m_data).slotIndex = slotIndex;
  (this->m_data).polymorphicInfoCount = 0;
  (this->m_data).propertyId = propertyId;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(this->m_data).protoObjectAddr,protoObject);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            (&(this->m_data).propertyGuardValueAddr,propertyGuard);
  ptr_00 = JITTimeConstructorCache::GetData(ctorCache);
  Memory::WriteBarrierPtr<JITTimeConstructorCacheIDL>::WriteBarrierSet
            (&(this->m_data).ctorCache,ptr_00);
  (this->m_data).fixedFieldCount = 1;
  (this->m_data).fixedFieldInfoArraySize = 1;
  ptr_01 = FixedFieldInfo::GetRaw(fixedFieldInfoArray);
  Memory::WriteBarrierPtr<FixedFieldIDL>::WriteBarrierSet
            (&(this->m_data).fixedFieldInfoArray,ptr_01);
  (this->m_data).polymorphicInfoArray.ptr = (ObjTypeSpecPolymorphicInfoIDL *)0x0;
  return;
}

Assistant:

ObjTypeSpecFldInfo(uint id, Js::TypeId typeId, JITType* initialType,
        bool usesAuxSlot, bool isLoadedFromProto, bool usesAccessor, bool isFieldValueFixed, bool keepFieldValue, bool isBuiltIn,
        uint16 slotIndex, Js::PropertyId propertyId, Js::DynamicObject* protoObject, Js::PropertyGuard* propertyGuard,
        JITTimeConstructorCache* ctorCache, FixedFieldInfo* fixedFieldInfoArray)
    {
        ObjTypeSpecFldInfoFlags flags(InitialObjTypeSpecFldInfoFlagValue);
        flags.isPolymorphic = false;
        flags.usesAuxSlot = usesAuxSlot;
        flags.isLocal = !isLoadedFromProto && !usesAccessor;
        flags.isLoadedFromProto = isLoadedFromProto;
        flags.usesAccessor = usesAccessor;
        flags.hasFixedValue = isFieldValueFixed;
        flags.keepFieldValue = keepFieldValue;
        flags.isBeingAdded = initialType != nullptr;
        flags.doesntHaveEquivalence = true; // doesn't mean anything for data from a monomorphic cache
        flags.isBuiltIn = isBuiltIn;
        m_data.flags = flags.flags;

        m_data.id = id;
        m_data.typeId = typeId;
        m_data.typeSet = nullptr;
        m_data.initialType = initialType->GetData();
        m_data.slotIndex = slotIndex;
        m_data.polymorphicInfoCount = 0;
        m_data.propertyId = propertyId;
        m_data.protoObjectAddr = protoObject;
        m_data.propertyGuardValueAddr = (void*)propertyGuard->GetAddressOfValue();
        m_data.ctorCache = ctorCache->GetData();
        m_data.fixedFieldCount = 1;
        m_data.fixedFieldInfoArraySize = 1;
        m_data.fixedFieldInfoArray = fixedFieldInfoArray->GetRaw();
        m_data.polymorphicInfoArray = nullptr;
    }